

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

void thanm_instr_free(thanm_instr_t *instr)

{
  list_node_t *local_20;
  list_node_t *node;
  thanm_param_t *param;
  thanm_instr_t *instr_local;
  
  for (local_20 = (instr->params).head; local_20 != (list_node_t *)0x0; local_20 = local_20->next) {
    thanm_param_free((thanm_param_t *)local_20->data);
  }
  list_free_nodes(&instr->params);
  free(instr);
  return;
}

Assistant:

static void
thanm_instr_free(
    thanm_instr_t* instr
) {
    thanm_param_t* param;
    list_for_each(&instr->params, param)
        thanm_param_free(param);
    list_free_nodes(&instr->params);

    free(instr);
}